

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall
MacProj::mac_project
          (MacProj *this,int level,MultiFab *u_mac,MultiFab *S,Real dt,Real time,MultiFab *divu,
          int have_divu,BCRec *density_math_bc,bool increment_vel_register)

{
  bool bVar1;
  int destcomp;
  int iVar2;
  AmrLevel **ppAVar3;
  BoxArray *area_00;
  DistributionMapping *pDVar4;
  NavierStokesBase *this_00;
  BndryRegister *this_01;
  BoxArray *area_01;
  MultiFab *mflx;
  FabFactory<amrex::FArrayBox> *__n;
  reference ppMVar5;
  FabArrayBase *in_RCX;
  MultiFab *in_RDX;
  int in_ESI;
  MacProj *in_RDI;
  Amr *in_R8;
  int in_R9D;
  uint in_stack_00000010;
  FrOp in_stack_00000018;
  Real sumreg_1;
  int dir_1;
  Real mult;
  Real sumreg;
  int dir;
  FluxRegister *mr;
  int idim_1;
  Array<MultiFab_*,_3> fluxes;
  int idim;
  Array<MultiFab_*,_3> umac;
  MultiFab rho;
  MultiFab *cphi;
  Real rhs_scale;
  MultiFab *rhotime;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> raii;
  MultiFab *area;
  NavierStokesBase *ns;
  MultiFab *mac_phi;
  int max_level;
  DistributionMapping *dmap;
  BoxArray *grids;
  pointer in_stack_fffffffffffff748;
  char (*x) [25];
  undefined4 uVar6;
  Amr *in_stack_fffffffffffff750;
  Real in_stack_fffffffffffff758;
  undefined1 *v;
  NavierStokesBase *in_stack_fffffffffffff760;
  undefined8 in_stack_fffffffffffff768;
  MFInfo *in_stack_fffffffffffff770;
  ostream *in_stack_fffffffffffff778;
  Print *in_stack_fffffffffffff780;
  BoxArray *in_stack_fffffffffffff788;
  MultiFab *in_stack_fffffffffffff790;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff7a0;
  Print *in_stack_fffffffffffff7c0;
  value_type in_stack_fffffffffffff7d8;
  int in_stack_fffffffffffff7e8;
  int iVar7;
  undefined4 in_stack_fffffffffffff800;
  pointer pMVar8;
  int in_stack_fffffffffffff96c;
  FluxRegister *in_stack_fffffffffffff970;
  int local_604;
  MultiFab *in_stack_fffffffffffffab0;
  MultiFab *in_stack_fffffffffffffab8;
  MultiFab *in_stack_fffffffffffffac0;
  MultiFab *in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffad4;
  MacProj *in_stack_fffffffffffffad8;
  int local_464;
  int local_454;
  int local_434;
  undefined1 local_430 [24];
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  char local_3e8 [40];
  MultiFab *in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc4c;
  MacProj *in_stack_fffffffffffffc50;
  BndryRegister *mult_00;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  FluxRegister *in_stack_fffffffffffffe28;
  Real in_stack_fffffffffffffe50;
  Real in_stack_fffffffffffffe58;
  Real in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  BCRec *in_stack_fffffffffffffe70;
  BCRec *in_stack_fffffffffffffe78;
  MultiFab *in_stack_fffffffffffffe80;
  Amr *in_stack_fffffffffffffe88;
  MacProj *in_stack_fffffffffffffe90;
  MultiFab *in_stack_fffffffffffffed0;
  MultiFab *in_stack_fffffffffffffed8;
  Array<MultiFab_*,_3> *in_stack_fffffffffffffee0;
  MultiFab *in_stack_fffffffffffffee8;
  Array<MultiFab_*,_3> *in_stack_fffffffffffffef0;
  MacProj *this_02;
  
  this_02 = in_RDI;
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    amrex::Print::operator<<
              ((Print *)in_stack_fffffffffffff750,(char (*) [26])in_stack_fffffffffffff748);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff750,(int *)in_stack_fffffffffffff748);
    in_stack_fffffffffffffe20 = CONCAT13(10,(int3)in_stack_fffffffffffffe20);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff750,(char *)in_stack_fffffffffffff748);
    amrex::Print::~Print(in_stack_fffffffffffff7c0);
  }
  ppAVar3 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
  area_00 = amrex::AmrLevel::boxArray(*ppAVar3);
  ppAVar3 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
  pDVar4 = amrex::AmrLevel::DistributionMap(*ppAVar3);
  destcomp = amrex::AmrMesh::maxLevel((AmrMesh *)in_RDI->parent);
  this_00 = (NavierStokesBase *)
            amrex::Amr::getLevel
                      (in_stack_fffffffffffff750,(int)((ulong)in_stack_fffffffffffff748 >> 0x20));
  NavierStokesBase::Area(this_00);
  std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
  unique_ptr<std::default_delete<amrex::MultiFab>,void>
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffff750);
  if (in_ESI == destcomp) {
    operator_new(0x180);
    amrex::MFInfo::MFInfo((MFInfo *)0x5a7f0b);
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
    in_stack_fffffffffffff748 =
         (pointer)amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff750);
    amrex::MultiFab::MultiFab
              (in_stack_fffffffffffff790,in_stack_fffffffffffff788,
               (DistributionMapping *)in_stack_fffffffffffff780,
               (int)((ulong)in_stack_fffffffffffff778 >> 0x20),(int)in_stack_fffffffffffff778,
               in_stack_fffffffffffff770,in_stack_fffffffffffff7a0);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    amrex::MFInfo::~MFInfo((MFInfo *)0x5a7f8f);
    this_01 = (BndryRegister *)
              std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                        ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                         in_stack_fffffffffffff750);
  }
  else {
    amrex::
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
    this_01 = (BndryRegister *)
              std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                        ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                         in_stack_fffffffffffff750);
  }
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff750,
             (value_type)in_stack_fffffffffffff748);
  NavierStokesBase::get_rho(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  amrex::MultiFab::Copy
            ((MultiFab *)in_stack_fffffffffffff780,(MultiFab *)in_stack_fffffffffffff778,
             (int)((ulong)in_stack_fffffffffffff770 >> 0x20),(int)in_stack_fffffffffffff770,
             (int)((ulong)in_stack_fffffffffffff768 >> 0x20),(int)in_stack_fffffffffffff768);
  bVar1 = OutFlowBC::HasOutFlowBC(in_RDI->phys_bc);
  if (((bVar1) && (in_R9D != 0)) && (do_outflow_bcs != 0)) {
    set_outflow_bcs(in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,in_stack_fffffffffffffac8,
                    in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  }
  if (in_ESI == 0) {
    pMVar8 = (pointer)0x0;
  }
  else {
    amrex::
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
    pMVar8 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                       ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                        in_stack_fffffffffffff750);
  }
  iVar7 = (int)((ulong)in_stack_fffffffffffff748 >> 0x20);
  area_01 = amrex::FabArrayBase::boxArray(in_RCX);
  mflx = (MultiFab *)amrex::FabArrayBase::DistributionMap(in_RCX);
  iVar2 = amrex::FabArrayBase::nGrow(in_RCX,0);
  local_408 = 0;
  uStack_400 = 0;
  local_418 = 0;
  uStack_410 = 0;
  local_3f8 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x5a81ec);
  amrex::Amr::getLevel(in_stack_fffffffffffff750,iVar7);
  __n = amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff750);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff790,in_stack_fffffffffffff788,
             (DistributionMapping *)in_stack_fffffffffffff780,
             (int)((ulong)in_stack_fffffffffffff778 >> 0x20),(int)in_stack_fffffffffffff778,
             in_stack_fffffffffffff770,in_stack_fffffffffffff7a0);
  amrex::MFInfo::~MFInfo((MFInfo *)0x5a8255);
  iVar7 = 0;
  amrex::FabArrayBase::nGrow(in_RCX,0);
  amrex::MultiFab::Copy
            ((MultiFab *)in_stack_fffffffffffff780,(MultiFab *)in_stack_fffffffffffff778,
             (int)((ulong)in_stack_fffffffffffff770 >> 0x20),(int)in_stack_fffffffffffff770,
             (int)((ulong)in_stack_fffffffffffff768 >> 0x20),(int)in_stack_fffffffffffff768);
  for (local_434 = 0; local_434 < 3; local_434 = local_434 + 1) {
    in_stack_fffffffffffff7d8 = in_RDX + local_434;
    ppMVar5 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                        ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff750,(size_type)__n);
    *ppMVar5 = in_stack_fffffffffffff7d8;
  }
  for (local_454 = 0; local_454 < 3; local_454 = local_454 + 1) {
    ppMVar5 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                        ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff750,(size_type)__n);
    *ppMVar5 = (value_type)0x0;
  }
  v = local_430;
  x = (char (*) [25])local_3e8;
  mult_00 = this_01;
  mlmg_mac_solve(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                 in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
  if (verbose != 0) {
    check_div_cond(this_02,in_ESI,in_RDX);
  }
  if ((in_stack_00000010 & 1) != 0) {
    if (in_ESI < in_RDI->finest_level) {
      amrex::
      Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                    *)in_R8,(size_type)x);
      std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>::operator*
                ((unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> *)in_R8
                );
      amrex::BndryRegister::setVal(this_01,(Real)v);
      for (local_464 = 0; local_464 < 3; local_464 = local_464 + 1) {
        in_R8 = (Amr *)((ulong)in_R8 & 0xffffffff00000000);
        x = (char (*) [25])CONCAT44((int)((ulong)x >> 0x20),1);
        amrex::FluxRegister::CrseInit
                  (in_stack_fffffffffffffe28,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (MultiFab *)area_00,(int)((ulong)pDVar4 >> 0x20),(int)pDVar4,destcomp,
                   in_stack_00000010,(Real)mult_00,in_stack_00000018);
      }
      if (verbose != 0) {
        amrex::FluxRegister::SumReg(in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
        in_stack_fffffffffffff7c0 = (Print *)amrex::OutStream();
        amrex::Print::Print(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
        amrex::Print::operator<<((Print *)in_R8,(char (*) [7])x);
        amrex::Print::operator<<((Print *)in_R8,(int *)x);
        amrex::Print::operator<<((Print *)in_R8,x);
        amrex::Print::operator<<((Print *)in_R8,(double *)x);
        amrex::Print::operator<<
                  ((Print *)in_R8,
                   (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                    *)x);
        amrex::Print::~Print(in_stack_fffffffffffff7c0);
      }
    }
    if (0 < in_ESI) {
      amrex::Amr::nCycle(in_R8,(int)((ulong)x >> 0x20));
      for (local_604 = 0; local_604 < 3; local_604 = local_604 + 1) {
        amrex::
        Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                      *)in_R8,(size_type)x);
        uVar6 = (undefined4)((ulong)x >> 0x20);
        std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>::operator->
                  ((unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> *)
                   0x5a86b4);
        x = (char (*) [25])CONCAT44(uVar6,1);
        amrex::FluxRegister::FineAdd
                  ((FluxRegister *)CONCAT44(iVar2,in_stack_fffffffffffff800),mflx,
                   (MultiFab *)area_01,iVar7,in_stack_fffffffffffff7e8,(int)((ulong)in_RCX >> 0x20),
                   (int)pMVar8,(Real)in_stack_fffffffffffff7d8);
      }
      if (verbose != 0) {
        amrex::
        Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                      *)in_R8,(size_type)x);
        std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>::operator->
                  ((unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> *)
                   0x5a8744);
        amrex::FluxRegister::SumReg(in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
        amrex::OutStream();
        amrex::Print::Print(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
        amrex::Print::operator<<((Print *)in_R8,(char (*) [7])x);
        amrex::Print::operator<<((Print *)in_R8,(int *)x);
        amrex::Print::operator<<((Print *)in_R8,(char (*) [24])x);
        amrex::Print::operator<<((Print *)in_R8,(double *)x);
        amrex::Print::operator<<
                  ((Print *)in_R8,
                   (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                    *)x);
        amrex::Print::~Print(in_stack_fffffffffffff7c0);
      }
    }
  }
  if (check_umac_periodicity != 0) {
    test_umac_periodic(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40
                      );
  }
  amrex::MultiFab::~MultiFab((MultiFab *)0x5a8869);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_R8);
  return;
}

Assistant:

void
MacProj::mac_project (int             level,
                      MultiFab*       u_mac,
                      MultiFab&       S,
                      Real            dt,
                      Real            time,
                      const MultiFab& divu,
                      int             have_divu,
                      const BCRec&    density_math_bc,
                      bool            increment_vel_register )
{
    BL_PROFILE("MacProj::mac_project()");
    if (verbose) amrex::Print() << "... mac_project at level " << level << '\n';

    const BoxArray& grids      = LevelData[level]->boxArray();
    const DistributionMapping& dmap = LevelData[level]->DistributionMap();
    const int       max_level  = parent->maxLevel();
    MultiFab*       mac_phi    = 0;
    NavierStokesBase&   ns     = *(NavierStokesBase*) &(parent->getLevel(level));
    const MultiFab*     area   = ns.Area();
    //
    // If finest level possible no need to make permanent mac_phi for bcs.
    //
    std::unique_ptr<MultiFab> raii;
    if (level == max_level) {
        raii.reset(new MultiFab(grids,dmap,1,1, MFInfo(), LevelData[level]->Factory()));
        mac_phi = raii.get();
    } else {
        mac_phi = mac_phi_crse[level].get();
    }

    mac_phi->setVal(0.0);
    //
    // HACK!!!
    //
    // Some of the routines we call assume that density has one valid
    // ghost cell.  We enforce that assumption by setting it here.
    //
    const MultiFab& rhotime = ns.get_rho(time);
    MultiFab::Copy(S, rhotime, 0, Density, 1, 1);

    if (OutFlowBC::HasOutFlowBC(phys_bc) && have_divu && do_outflow_bcs) {
        set_outflow_bcs(level, mac_phi, u_mac, S, divu);
    }

    //
    //  Set up the mac projection
    //
    const Real rhs_scale = 2.0/dt;

    const MultiFab* cphi = (level == 0) ? nullptr : mac_phi_crse[level-1].get();

    // Set bcoefs to the average of Density at the faces
    // In the EB case, they will be defined at the Face Centroid
    MultiFab rho(S.boxArray(),S.DistributionMap(), 1, S.nGrow(),
                 MFInfo(), (parent->getLevel(level)).Factory());
    MultiFab::Copy(rho, S, Density, 0, 1, S.nGrow()); // Extract rho component from S

    Array<MultiFab*,AMREX_SPACEDIM>  umac;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        umac[idim]= &(u_mac[idim]);

    Array<MultiFab*,AMREX_SPACEDIM>  fluxes;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
      // We don't need the fluxes, so nullptr means we won't compute them
      fluxes[idim]= nullptr;

    //
    // Perform projection
    //
    mlmg_mac_solve(parent, cphi, *phys_bc, density_math_bc, level,
		   mac_tol, mac_abs_tol, rhs_scale,
		   rho, divu, umac, mac_phi, fluxes);

    //
    // Test that u_mac is divergence free
    //
    if (verbose)
        check_div_cond(level, u_mac);

    if (increment_vel_register)
    {
        //
        // Store advection velocities in mac registers at crse/fine boundaries.
        //
        // Initialize advection velocity registers with coarse grid velocity.
        //
        if (level < finest_level)
        {
            FluxRegister& mr = *mac_reg[level+1];

            mr.setVal(0.0);

            for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
            {
                mr.CrseInit(u_mac[dir],area[dir],dir,0,0,1,-1.0);
            }

            if (verbose)
            {
                Real sumreg = mr.SumReg(0);

                amrex::Print() << "LEVEL " << level << " MACREG: CrseInit sum = " << sumreg << std::endl;
            }
        }
        //
        // Increment in fine grid velocity to velocity registers.
        //
        if (level > 0)
        {
            const Real mult = 1.0/Real(parent->nCycle(level));

            for (int dir = 0; dir < BL_SPACEDIM; dir++)
            {
                mac_reg[level]->FineAdd(u_mac[dir],area[dir],dir,0,0,1,mult);
            }

            if (verbose)
            {
                Real sumreg = mac_reg[level]->SumReg(0);
                amrex::Print() << "LEVEL "                  << level
                               << " MACREG: FineAdd sum = " << sumreg << std::endl;
            }
        }
    }

    if (check_umac_periodicity)
        test_umac_periodic(level,u_mac);

}